

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

int Amap_ManFindCut(Amap_Obj_t *pNode,Amap_Obj_t *pFanin,int fComplFanin,int Val,Vec_Ptr_t *vCuts)

{
  int iVar1;
  int local_40;
  int iFan;
  int iCompl;
  int c;
  Amap_Cut_t *pCut;
  Vec_Ptr_t *vCuts_local;
  int Val_local;
  int fComplFanin_local;
  Amap_Obj_t *pFanin_local;
  Amap_Obj_t *pNode_local;
  
  Vec_PtrClear(vCuts);
  iFan = 0;
  _iCompl = (Amap_Cut_t *)(pFanin->field_11).pData;
  while (iFan < (int)(*(uint *)&pFanin->field_0x8 >> 0xc)) {
    if (((uint)*_iCompl & 0xffff) == 0) {
      local_40 = 0;
    }
    else {
      local_40 = Abc_Var2Lit((uint)*_iCompl & 0xffff,(uint)*_iCompl >> 0x10 & 1 ^ fComplFanin);
    }
    if (local_40 == Val) {
      Vec_PtrPush(vCuts,_iCompl);
    }
    iFan = iFan + 1;
    _iCompl = Amap_ManCutNext(_iCompl);
  }
  iVar1 = Vec_PtrSize(vCuts);
  return (int)(iVar1 == 0);
}

Assistant:

int Amap_ManFindCut( Amap_Obj_t * pNode, Amap_Obj_t * pFanin, int fComplFanin, int Val, Vec_Ptr_t * vCuts )
{
    Amap_Cut_t * pCut;
    int c, iCompl, iFan;
    Vec_PtrClear( vCuts );
    Amap_NodeForEachCut( pFanin, pCut, c )
    {
        iCompl = pCut->fInv ^ fComplFanin;
        iFan   = !pCut->iMat? 0: Abc_Var2Lit( pCut->iMat, iCompl );
        if ( iFan == Val )
            Vec_PtrPush( vCuts, pCut );
    }
    return Vec_PtrSize(vCuts) == 0;
}